

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
kratos::Generator::handle_name_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,bool ignore_top)

{
  Generator *this_00;
  undefined8 this_01;
  bool bVar1;
  IRNodeKind IVar2;
  IRNode *this_02;
  Stmt *stmt;
  InternalException *this_03;
  char (*format_str) [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  optional<unsigned_long> oVar3;
  basic_string_view<char> bVar4;
  string_view format_str_00;
  format_args args;
  allocator<char> local_231;
  string local_230 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  string local_1f8;
  uint local_1d4;
  iterator iStack_1d0;
  uint starting;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  const_iterator local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  const_iterator local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  const_iterator local_190;
  undefined1 local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  string local_160;
  enable_shared_from_this<kratos::Stmt> local_140;
  _Storage<unsigned_long,_true> local_130;
  optional<unsigned_long> index;
  undefined1 local_110 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> label;
  ForStmt *for_;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  Generator *current;
  bool ignore_top_local;
  Generator *this_local;
  string *result;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *vargs;
  char (*local_48) [9];
  char *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_10;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->instance_name);
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  do {
    if (values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      local_1d4 = ignore_top & 1;
      local_208._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d0);
      local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&local_208,(ulong)local_1d4);
      local_210._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_230,".",&local_231);
      string::
      join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&local_1f8,(string *)local_200,local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                 (string *)in_R8.values_);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator(&local_231);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d0);
      return __return_storage_ptr__;
    }
    if ((values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage[0x16].field_2._M_allocated_capacity == 0
        ) || (*(long *)(values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x29) == 0)) {
LAB_001bc512:
      local_1c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1c0,&local_1c8);
      iStack_1d0 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                   emplace<std::__cxx11::string_const&>
                             ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              local_d0,local_1c0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&values.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage[4].field_2
                              + 8));
    }
    else {
      this_02 = (IRNode *)
                (**(code **)(**(long **)(values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x29)
                            + 0x20))();
      IVar2 = IRNode::ir_node_kind(this_02);
      if (IVar2 != StmtKind) goto LAB_001bc512;
      label.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._32_8_ = (**(code **)(**(long **)(values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x29)
                            + 0x20))();
      this_00 = (Generator *)
                values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[0x16].field_2.
                _M_allocated_capacity;
      ForStmt::get_loop_body
                ((ForStmt *)
                 &index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged);
      stmt = (Stmt *)std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *
                                )&index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_long>._M_engaged);
      get_block_name_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,this_00,stmt);
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)
                 &index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged);
      this_01 = label.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._32_8_;
      std::enable_shared_from_this<kratos::Stmt>::shared_from_this(&local_140);
      oVar3 = ForStmt::genvar_index((ForStmt *)this_01,(shared_ptr<kratos::Stmt> *)&local_140);
      local_130._M_value =
           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&local_140);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_110);
      if (!bVar1) {
LAB_001bc1be:
        n.field_2._M_local_buf[0xe] = '\x01';
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"Invalid state of genvar instance array",
                   (allocator<char> *)(n.field_2._M_local_buf + 0xf));
        InternalException::InternalException(this_03,&local_160);
        n.field_2._M_local_buf[0xe] = '\0';
        __cxa_throw(this_03,&InternalException::typeinfo,InternalException::~InternalException);
      }
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_130);
      if (!bVar1) goto LAB_001bc1be;
      format_str = (char (*) [9])
                   ((long)&values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[4].field_2 + 8);
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_130);
      local_38 = local_188;
      local_40 = "{0}[{1}]";
      local_48 = format_str;
      fmt::v7::make_args_checked<std::__cxx11::string_const&,unsigned_long&,char[9],char>
                (&local_78,(v7 *)"{0}[{1}]",format_str,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,
                 (remove_reference_t<unsigned_long_&> *)in_R8.values_);
      local_58 = &local_78;
      bVar4 = fmt::v7::to_string_view<char,_0>(local_40);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&result;
      local_30 = local_58;
      local_20 = local_58;
      local_10 = local_58;
      local_18 = local_28;
      local_88 = bVar4;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0x4d,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_58);
      format_str_00.size_ = (size_t)result;
      format_str_00.data_ = (char *)local_88.size_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_90.values_;
      in_R8 = local_90;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_188,(detail *)local_88.data_,format_str_00,args);
      local_198._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_190,&local_198);
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace<std::__cxx11::string&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_d0,local_190,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_188);
      local_1b0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1a8,&local_1b0);
      __args = std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_110);
      local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace<std::__cxx11::string&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_d0,local_1a8,__args);
      std::__cxx11::string::~string((string *)local_188);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_110);
    }
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[0x16].field_2.
                  _M_allocated_capacity;
  } while( true );
}

Assistant:

std::string Generator::handle_name(bool ignore_top) const {
    // this is used to identify the generator from the top level
    std::string result = instance_name;
    auto const *current = this;
    std::vector<std::string> values;
    while (current != nullptr) {
        // need to check if we are in a gen block
        if (current->parent_generator_ && current->instantiation_stmt_ &&
            current->instantiation_stmt_->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            // need to find out the label
            // need two parents since the previous parent is a stmt block
            auto *for_ = reinterpret_cast<ForStmt *>(current->instantiation_stmt_->parent());
            auto label = current->parent_generator_->get_block_name(for_->get_loop_body().get());
            // need to find out the index
            auto index = for_->genvar_index(current->instantiation_stmt_->shared_from_this());
            if (!label || !index) {
                throw InternalException("Invalid state of genvar instance array");
            }

            auto n = ::format("{0}[{1}]", current->instance_name, *index);
            values.emplace(values.begin(), n);
            values.emplace(values.begin(), *label);
        } else {
            values.emplace(values.begin(), current->instance_name);
        }

        current = current->parent_generator_;
    }
    auto starting = ignore_top ? 1u : 0u;
    result = string::join(values.begin() + starting, values.end(), ".");

    return result;
}